

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

QNetworkCacheMetaData __thiscall
QNetworkReplyHttpImplPrivate::fetchCacheMetaData
          (QNetworkReplyHttpImplPrivate *this,QNetworkCacheMetaData *oldMetaData)

{
  long lVar1;
  QByteArrayView header;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  Operation OVar5;
  qsizetype qVar6;
  ulong uVar7;
  Node<QByteArray,_QByteArray> *pNVar8;
  QNetworkCacheMetaData *in_RDX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar9;
  long lVar10;
  ulong uVar11;
  long i;
  long in_FS_OFFSET;
  QLatin1StringView QVar12;
  QByteArrayView QVar13;
  QByteArrayView value;
  QAnyStringView name;
  QAnyStringView name_00;
  QAnyStringView newValue;
  Attribute copy;
  QDateTime dt;
  QHttpHeaders newHeaders;
  QHttpHeaders cacheHeaders;
  QDateTime expiredDateTime;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_c0;
  size_t local_b0;
  QHash<QNetworkRequest::Attribute,_QVariant> local_90;
  QByteArray local_88;
  QHash<QByteArray,_QByteArray> local_70;
  QHttpHeaders local_68;
  QNetworkCacheMetaData QVar14;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 uVar15;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&this->super_QNetworkReplyPrivate = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::QNetworkCacheMetaData((QNetworkCacheMetaData *)this,in_RDX);
  QVar14.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers((QNetworkCacheMetaData *)&stack0xffffffffffffffa0);
  local_68.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkReply::headers((QNetworkReply *)&local_68);
  qVar6 = QHttpHeaders::size(&local_68);
  if (0 < qVar6) {
    i = 0;
    do {
      QVar12 = QHttpHeaders::nameAt(&local_68,i);
      aVar9 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar12.m_data;
      uVar7 = QVar12.m_size;
      QVar13 = QHttpHeaders::valueAt(&local_68,i);
      uVar11 = 3;
      lVar10 = 0;
      do {
        local_c0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar13.m_data;
        local_b0 = QVar13.m_size;
        iVar4 = qstrnicmp(aVar9.m_data_utf8,uVar7,*(char **)((long)&DAT_002cf768 + lVar10),
                          *(longlong *)((long)&DAT_002cf760 + lVar10));
        if (iVar4 == 0) {
          if (lVar10 != 0x80) goto LAB_00218846;
          break;
        }
        iVar4 = qstrnicmp(aVar9.m_data_utf8,uVar7,
                          *(char **)((long)&PTR_anon_var_dwarf_7237c8_002cf778 + lVar10),
                          *(longlong *)((long)&DAT_002cf770 + lVar10));
        if (((iVar4 == 0) ||
            (iVar4 = qstrnicmp(aVar9.m_data_utf8,uVar7,
                               *(char **)((long)&PTR_anon_var_dwarf_604cba_002cf788 + lVar10),
                               *(longlong *)((long)&DAT_002cf780 + lVar10)), iVar4 == 0)) ||
           (iVar4 = qstrnicmp(aVar9.m_data_utf8,uVar7,
                              *(char **)((long)&PTR_anon_var_dwarf_604cd1_002cf798 + lVar10),
                              *(longlong *)((long)&DAT_002cf790 + lVar10)), iVar4 == 0))
        goto LAB_00218846;
        lVar10 = lVar10 + 0x40;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
      iVar4 = QtPrivate::compareStrings(uVar7,aVar9.m_data,"set-cookie",10,0);
      if ((iVar4 != 0) &&
         (((iVar4 = QtPrivate::compareStrings(uVar7,aVar9.m_data,"warning",7,0),
           local_b0 != 3 || iVar4 != 0 || (*local_c0.m_data_utf8 != '1')) ||
          ((9 < (int)*(char *)((long)local_c0.m_data + 1) - 0x30U ||
           (9 < (int)*(char *)((long)local_c0.m_data + 2) - 0x30U)))))) {
        name.m_size = uVar7 | 0x4000000000000000;
        name.field_0.m_data_utf8 = (char *)aVar9.m_data;
        bVar3 = QHttpHeaders::contains((QHttpHeaders *)&stack0xffffffffffffffa0,name);
        if (((!bVar3) ||
            (((iVar4 = qstrnicmp(aVar9.m_data_utf8,uVar7,"content-encoding",0x10), iVar4 != 0 &&
              (iVar4 = qstrnicmp(aVar9.m_data_utf8,uVar7,"content-range",0xd), iVar4 != 0)) &&
             (iVar4 = qstrnicmp(aVar9.m_data_utf8,uVar7,"content-type",0xc), iVar4 != 0)))) &&
           ((*(int *)&oldMetaData[0x4b].d.d.ptr != 0x130 ||
            (iVar4 = QtPrivate::compareStrings(uVar7,aVar9.m_data,"content-length",0xe,0),
            iVar4 != 0)))) {
          name_00.m_size = name.m_size;
          name_00.field_0.m_data_utf8 = (char *)aVar9.m_data;
          newValue.m_size = local_b0;
          newValue.field_0.m_data_utf8 = (char *)local_c0.m_data;
          QHttpHeaders::replaceOrAppend((QHttpHeaders *)&stack0xffffffffffffffa0,name_00,newValue);
        }
      }
LAB_00218846:
      i = i + 1;
      qVar6 = QHttpHeaders::size(&local_68);
    } while (i < qVar6);
  }
  QNetworkCacheMetaData::setHeaders
            ((QNetworkCacheMetaData *)this,(QHttpHeaders *)&stack0xffffffffffffffa0);
  local_70.d = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0;
  QVar13 = QHttpHeaders::value((QHttpHeaders *)&stack0xffffffffffffffa0,CacheControl,
                               (QByteArrayView)ZEXT816(0));
  if (QVar13.m_size == 0) {
    QVar13 = QHttpHeaders::value((QHttpHeaders *)&stack0xffffffffffffffa0,Expires,
                                 (QByteArrayView)ZEXT816(0));
    if ((storage_type *)QVar13.m_size != (storage_type *)0x0) {
      QVar13.m_data = (storage_type *)QVar13.m_size;
      QVar13.m_size = (qsizetype)&stack0xffffffffffffffa8;
      QNetworkHeadersPrivate::fromHttpDate(QVar13);
      QNetworkCacheMetaData::setExpirationDate
                ((QNetworkCacheMetaData *)this,(QDateTime *)&stack0xffffffffffffffa8);
      QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffa8);
    }
  }
  else {
    header.m_data = (storage_type *)in_stack_ffffffffffffffa8;
    header.m_size = (qsizetype)QVar14.d.d.ptr;
    parseHttpOptionHeader(header);
    local_70.d = (Data *)local_88.d.d;
    local_88.d.d = (Data *)0x0;
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)&stack0xffffffffffffffa8)
    ;
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)&local_88);
    uVar15 = &DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = "max-age";
    local_88.d.size = 7;
    QHash<QByteArray,_QByteArray>::value((QByteArray *)&stack0xffffffffffffffa8,&local_70,&local_88)
    ;
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDateTime::currentDateTimeUtc();
    QByteArray::toInt((bool *)&stack0xffffffffffffffa8,0);
    QDateTime::addSecs((longlong)&local_90);
    pDVar2 = local_88.d.d;
    local_88.d.d = (Data *)local_90.d;
    local_90.d = (Data *)pDVar2;
    QDateTime::~QDateTime((QDateTime *)&local_90);
    QNetworkCacheMetaData::setExpirationDate((QNetworkCacheMetaData *)this,(QDateTime *)&local_88);
    QDateTime::~QDateTime((QDateTime *)&local_88);
    if ((Data *)uVar15 != (Data *)0x0) {
      LOCK();
      *(int *)uVar15 = *(int *)uVar15 + -1;
      UNLOCK();
      if (*(int *)uVar15 == 0) {
        QArrayData::deallocate((QArrayData *)uVar15,1,0x10);
      }
    }
  }
  QVar13 = QHttpHeaders::value((QHttpHeaders *)&stack0xffffffffffffffa0,LastModified,
                               (QByteArrayView)ZEXT816(0));
  if ((storage_type *)QVar13.m_size != (storage_type *)0x0) {
    value.m_data = (storage_type *)QVar13.m_size;
    value.m_size = (qsizetype)&stack0xffffffffffffffa8;
    QNetworkHeadersPrivate::fromHttpDate(value);
    QNetworkCacheMetaData::setLastModified
              ((QNetworkCacheMetaData *)this,(QDateTime *)&stack0xffffffffffffffa8);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffa8);
  }
  OVar5 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)(oldMetaData + 0x48));
  if (OVar5 == Get) {
    uVar15 = (Data *)0x0;
    if (local_70.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
      bVar3 = true;
      goto LAB_00218b3e;
    }
    pNVar8 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::findNode<QByteArray>
                       (local_70.d,(QByteArray *)&stack0xffffffffffffffa8);
    bVar3 = pNVar8 == (Node<QByteArray,_QByteArray> *)0x0;
  }
  else {
    OVar5 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)(oldMetaData + 0x48));
    if ((OVar5 != Post) ||
       (uVar15 = (Data *)0x0, local_70.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0
       )) {
      bVar3 = false;
      goto LAB_00218b3e;
    }
    pNVar8 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::findNode<QByteArray>
                       (local_70.d,(QByteArray *)&stack0xffffffffffffffa8);
    bVar3 = pNVar8 != (Node<QByteArray,_QByteArray> *)0x0;
  }
  if ((Data *)uVar15 != (Data *)0x0) {
    LOCK();
    *(int *)uVar15 = *(int *)uVar15 + -1;
    UNLOCK();
    if (*(int *)uVar15 == 0) {
      QArrayData::deallocate((QArrayData *)uVar15,1,0x10);
    }
  }
LAB_00218b3e:
  QNetworkCacheMetaData::setSaveToDisk((QNetworkCacheMetaData *)this,bVar3);
  local_88.d.d = (Data *)0x0;
  iVar4 = *(int *)&oldMetaData[0x4b].d.d.ptr;
  if (iVar4 == 0x130) {
    QNetworkCacheMetaData::attributes(in_RDX);
    local_88.d.d = (Data *)local_90.d;
    local_90.d = (Data *)0x0;
    QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)&stack0xffffffffffffffa8);
    QHash<QNetworkRequest::Attribute,_QVariant>::~QHash(&local_90);
  }
  else {
    QVariant::QVariant((QVariant *)&stack0xffffffffffffffa8,iVar4);
    local_90.d = local_90.d & 0xffffffff00000000;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&local_88,(Attribute *)&local_90,
               (QVariant *)&stack0xffffffffffffffa8);
    QVariant::~QVariant((QVariant *)&stack0xffffffffffffffa8);
    QVariant::QVariant((QVariant *)&stack0xffffffffffffffa8,(QString *)(oldMetaData + 0x4c));
    local_90.d._0_4_ = 1;
    QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::Attribute,QVariant> *)&local_88,(Attribute *)&local_90,
               (QVariant *)&stack0xffffffffffffffa8);
    QVariant::~QVariant((QVariant *)&stack0xffffffffffffffa8);
  }
  QNetworkCacheMetaData::setAttributes((QNetworkCacheMetaData *)this,(AttributesMap *)&local_88);
  QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
            ((QHash<QNetworkRequest::Attribute,_QVariant> *)&local_88);
  QHash<QByteArray,_QByteArray>::~QHash(&local_70);
  QHttpHeaders::~QHttpHeaders(&local_68);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&stack0xffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
           (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkCacheMetaData QNetworkReplyHttpImplPrivate::fetchCacheMetaData(const QNetworkCacheMetaData &oldMetaData) const
{
    Q_Q(const QNetworkReplyHttpImpl);

    QNetworkCacheMetaData metaData = oldMetaData;
    QHttpHeaders cacheHeaders = metaData.headers();

    const auto newHeaders = q->headers();
    for (qsizetype i = 0; i < newHeaders.size(); ++i) {
        const auto name = newHeaders.nameAt(i);
        const auto value = newHeaders.valueAt(i);

        if (isHopByHop(name))
            continue;

        if (name.compare("set-cookie", Qt::CaseInsensitive) == 0)
            continue;

        // for 4.6.0, we were planning to not store the date header in the
        // cached resource; through that we planned to reduce the number
        // of writes to disk when using a QNetworkDiskCache (i.e. don't
        // write to disk when only the date changes).
        // However, without the date we cannot calculate the age of the page
        // anymore.
        //if (header == "date")
            //continue;

        // Don't store Warning 1xx headers
        if (name.compare("warning", Qt::CaseInsensitive) == 0) {
            if (value.size() == 3
                && value[0] == '1'
                && isAsciiDigit(value[1])
                && isAsciiDigit(value[2]))
                continue;
        }

        if (cacheHeaders.contains(name)) {
            // Match the behavior of Firefox and assume Cache-Control: "no-transform"
            constexpr QByteArrayView headers[]=
                    {"content-encoding", "content-range", "content-type"};
            if (std::any_of(std::begin(headers), std::end(headers), caseInsensitiveCompare(name)))
                continue;
        }

        // IIS has been known to send "Content-Length: 0" on 304 responses, so
        // ignore this too
        if (statusCode == 304 && name.compare("content-length", Qt::CaseInsensitive) == 0)
            continue;

#if defined(QNETWORKACCESSHTTPBACKEND_DEBUG)
        QByteArrayView n = newHeaders.value(name);
        QByteArrayView o = cacheHeaders.value(name);
        if (n != o && name.compare("date", Qt::CaseInsensitive) != 0) {
            qDebug() << "replacing" << name;
            qDebug() << "new" << n;
            qDebug() << "old" << o;
        }
#endif
        cacheHeaders.replaceOrAppend(name, value);
    }
    metaData.setHeaders(cacheHeaders);

    bool checkExpired = true;

    QHash<QByteArray, QByteArray> cacheControl;
    auto value = cacheHeaders.value(QHttpHeaders::WellKnownHeader::CacheControl);
    if (!value.empty()) {
        cacheControl = parseHttpOptionHeader(value);
        QByteArray maxAge = cacheControl.value("max-age"_ba);
        if (!maxAge.isEmpty()) {
            checkExpired = false;
            QDateTime dt = QDateTime::currentDateTimeUtc();
            dt = dt.addSecs(maxAge.toInt());
            metaData.setExpirationDate(dt);
        }
    }
    if (checkExpired) {
        if (const auto value = cacheHeaders.value(
                    QHttpHeaders::WellKnownHeader::Expires); !value.isEmpty()) {
            QDateTime expiredDateTime = QNetworkHeadersPrivate::fromHttpDate(value);
            metaData.setExpirationDate(expiredDateTime);
        }
    }

    if (const auto value = cacheHeaders.value(
                QHttpHeaders::WellKnownHeader::LastModified); !value.isEmpty()) {
        metaData.setLastModified(QNetworkHeadersPrivate::fromHttpDate(value));
    }


    bool canDiskCache;
    // only cache GET replies by default, all other replies (POST, PUT, DELETE)
    //  are not cacheable by default (according to RFC 2616 section 9)
    if (httpRequest.operation() == QHttpNetworkRequest::Get) {

        canDiskCache = true;
        // HTTP/1.1. Check the Cache-Control header
        if (cacheControl.contains("no-store"_ba))
            canDiskCache = false;

    // responses to POST might be cacheable
    } else if (httpRequest.operation() == QHttpNetworkRequest::Post) {

        canDiskCache = false;
        // some pages contain "expires:" and "cache-control: no-cache" field,
        // so we only might cache POST requests if we get "cache-control: max-age ..."
        if (cacheControl.contains("max-age"_ba))
            canDiskCache = true;

    // responses to PUT and DELETE are not cacheable
    } else {
        canDiskCache = false;
    }

    metaData.setSaveToDisk(canDiskCache);
    QNetworkCacheMetaData::AttributesMap attributes;
    if (statusCode != 304) {
        // update the status code
        attributes.insert(QNetworkRequest::HttpStatusCodeAttribute, statusCode);
        attributes.insert(QNetworkRequest::HttpReasonPhraseAttribute, reasonPhrase);
    } else {
        // this is a redirection, keep the attributes intact
        attributes = oldMetaData.attributes();
    }
    metaData.setAttributes(attributes);
    return metaData;
}